

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O3

int doindent(int cols)

{
  int iVar1;
  
  if ((curbp->b_flag & 4U) != 0) {
    iVar1 = linsert(cols,0x20);
    return iVar1;
  }
  iVar1 = curbp->b_tabw;
  if (cols / iVar1 == 0) {
LAB_0011a6d3:
    if (cols % iVar1 != 0) {
      iVar1 = linsert(cols % iVar1,0x20);
      if (iVar1 == 0) goto LAB_0011a703;
    }
    iVar1 = 1;
  }
  else {
    iVar1 = linsert(cols / iVar1,9);
    if (iVar1 != 0) {
      iVar1 = curbp->b_tabw;
      goto LAB_0011a6d3;
    }
LAB_0011a703:
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
doindent(int cols)
{
	int n;

	if (curbp->b_flag & BFNOTAB)
		return (linsert(cols, ' '));
	if ((n = cols / curbp->b_tabw) != 0 && linsert(n, '\t') == FALSE)
		return (FALSE);
	if ((n = cols % curbp->b_tabw) != 0 && linsert(n, ' ') == FALSE)
		return (FALSE);
	return (TRUE);
}